

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trackable.cpp
# Opt level: O0

void copy_test(void)

{
  bool bVar1;
  test_struct *ptVar2;
  size_t sVar3;
  undefined1 local_68 [8];
  trackable_ptr<test_struct> p2;
  trackable_ptr<test_struct> p1;
  undefined1 local_30 [8];
  trackable<test_struct> d2;
  undefined1 local_18 [8];
  trackable<test_struct> d1;
  
  test_struct::test_struct((test_struct *)&d2.field_0xc,1);
  tower120::trackable<test_struct>::trackable
            ((trackable<test_struct> *)local_18,(test_struct *)&d2.field_0xc);
  test_struct::~test_struct((test_struct *)&d2.field_0xc);
  test_struct::test_struct((test_struct *)((long)&p1.super_trackable_ptr_base.prev + 4),2);
  tower120::trackable<test_struct>::trackable
            ((trackable<test_struct> *)local_30,
             (test_struct *)((long)&p1.super_trackable_ptr_base.prev + 4));
  test_struct::~test_struct((test_struct *)((long)&p1.super_trackable_ptr_base.prev + 4));
  tower120::trackable_ptr<test_struct>::trackable_ptr
            ((trackable_ptr<test_struct> *)&p2.super_trackable_ptr_base.prev,
             (trackable<test_struct> *)local_18);
  tower120::trackable_ptr<test_struct>::trackable_ptr
            ((trackable_ptr<test_struct> *)local_68,(trackable<test_struct> *)local_30);
  ptVar2 = tower120::trackable_ptr<test_struct>::operator->
                     ((trackable_ptr<test_struct> *)&p2.super_trackable_ptr_base.prev);
  if (ptVar2->i != 1) {
    detail::require_failed
              ("p1->i == 1",
               "/workspace/llm4binary/github/license_c_cmakelists/tower120[P]trackable_ptr/test/trackable.cpp"
               ,0x23);
  }
  ptVar2 = tower120::trackable_ptr<test_struct>::operator->((trackable_ptr<test_struct> *)local_68);
  if (ptVar2->i != 2) {
    detail::require_failed
              ("p2->i == 2",
               "/workspace/llm4binary/github/license_c_cmakelists/tower120[P]trackable_ptr/test/trackable.cpp"
               ,0x24);
  }
  tower120::trackable<test_struct>::operator=
            ((trackable<test_struct> *)local_18,(trackable<test_struct> *)local_30);
  ptVar2 = tower120::trackable_ptr<test_struct>::operator->
                     ((trackable_ptr<test_struct> *)&p2.super_trackable_ptr_base.prev);
  if (ptVar2->i != 2) {
    detail::require_failed
              ("p1->i == 2",
               "/workspace/llm4binary/github/license_c_cmakelists/tower120[P]trackable_ptr/test/trackable.cpp"
               ,0x26);
  }
  ptVar2 = tower120::trackable_ptr<test_struct>::operator->((trackable_ptr<test_struct> *)local_68);
  if (ptVar2->i != 2) {
    detail::require_failed
              ("p2->i == 2",
               "/workspace/llm4binary/github/license_c_cmakelists/tower120[P]trackable_ptr/test/trackable.cpp"
               ,0x27);
  }
  bVar1 = tower120::trackable_ptr<test_struct>::operator!=
                    ((trackable_ptr<test_struct> *)&p2.super_trackable_ptr_base.prev,
                     (trackable_ptr<test_struct> *)local_68);
  if (!bVar1) {
    detail::require_failed
              ("p1 != p2",
               "/workspace/llm4binary/github/license_c_cmakelists/tower120[P]trackable_ptr/test/trackable.cpp"
               ,0x29);
  }
  sVar3 = tower120::ptrs_count((trackable_base *)local_18);
  if (sVar3 != 1) {
    detail::require_failed
              ("ptrs_count(d1) == 1",
               "/workspace/llm4binary/github/license_c_cmakelists/tower120[P]trackable_ptr/test/trackable.cpp"
               ,0x2b);
  }
  sVar3 = tower120::ptrs_count((trackable_base *)local_30);
  if (sVar3 != 1) {
    detail::require_failed
              ("ptrs_count(d2) == 1",
               "/workspace/llm4binary/github/license_c_cmakelists/tower120[P]trackable_ptr/test/trackable.cpp"
               ,0x2c);
  }
  tower120::trackable_ptr<test_struct>::~trackable_ptr((trackable_ptr<test_struct> *)local_68);
  tower120::trackable_ptr<test_struct>::~trackable_ptr
            ((trackable_ptr<test_struct> *)&p2.super_trackable_ptr_base.prev);
  tower120::trackable<test_struct>::~trackable((trackable<test_struct> *)local_30);
  tower120::trackable<test_struct>::~trackable((trackable<test_struct> *)local_18);
  return;
}

Assistant:

void copy_test(){
    trackable<test_struct> d1{{1}};
    trackable<test_struct> d2{{2}};

    trackable_ptr<test_struct> p1 {&d1};
    trackable_ptr<test_struct> p2 {&d2};
    REQUIRE(p1->i == 1);
    REQUIRE(p2->i == 2);
    d1 = d2;
    REQUIRE(p1->i == 2);
    REQUIRE(p2->i == 2);

    REQUIRE(p1 != p2);

    REQUIRE(ptrs_count(d1) == 1);
    REQUIRE(ptrs_count(d2) == 1);
}